

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O0

void __thiscall
CAtEmLogging::SetLogErrBuf(CAtEmLogging *this,EC_T_BYTE *pbyLogMem,EC_T_DWORD dwSize)

{
  EC_T_DWORD dwSize_local;
  EC_T_BYTE *pbyLogMem_local;
  CAtEmLogging *this_local;
  
  SetMsgBuf(this->m_pErrorMsgBufferDesc,pbyLogMem,dwSize);
  return;
}

Assistant:

EC_T_VOID CAtEmLogging::SetLogErrBuf( EC_T_BYTE* pbyLogMem, EC_T_DWORD dwSize )
{
    SetMsgBuf( m_pErrorMsgBufferDesc, pbyLogMem, dwSize );
}